

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
aeron::archive::AeronArchive::pollForErrorResponse_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,AeronArchive *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Value VVar4;
  int64_t iVar5;
  string *psVar6;
  int in_ECX;
  nfds_t __nfds;
  AeronArchive *__fds;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->lock_;
  local_30._M_owns = false;
  __fds = this;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  iVar3 = ControlResponsePoller::poll
                    ((this->controlResponsePoller_)._M_t.
                     super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                     .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                     _M_head_impl,(pollfd *)__fds,__nfds,in_ECX);
  if (iVar3 != 0) {
    bVar2 = ControlResponsePoller::isPollComplete
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (bVar2) {
      iVar5 = ControlResponsePoller::controlSessionId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar5 == this->controlSessionId_) {
        iVar5 = ControlResponsePoller::templateId
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (iVar5 == 1) {
          VVar4 = ControlResponsePoller::code
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          if (VVar4 == ERROR) {
            psVar6 = ControlResponsePoller::errorMessage_abi_cxx11_
                               ((this->controlResponsePoller_)._M_t.
                                super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                                .
                                super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>
                                ._M_head_impl);
            (__return_storage_ptr__->super_type).m_initialized = false;
            (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
                 (type)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
            pcVar1 = (psVar6->_M_dataplus)._M_p;
            bVar2 = true;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&(__return_storage_ptr__->super_type).m_storage,pcVar1,
                       pcVar1 + psVar6->_M_string_length);
            goto LAB_001305e2;
          }
        }
      }
    }
  }
  bVar2 = false;
LAB_001305e2:
  (__return_storage_ptr__->super_type).m_initialized = bVar2;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<std::string> AeronArchive::pollForErrorResponse() {
    std::unique_lock<std::mutex> lock(lock_);

    if (controlResponsePoller_->poll() != 0 && controlResponsePoller_->isPollComplete()) {
        if (controlResponsePoller_->controlSessionId() == controlSessionId_ &&
            controlResponsePoller_->templateId() == codecs::ControlResponse::sbeTemplateId() &&
            controlResponsePoller_->code() == codecs::ControlResponseCode::ERROR) {
            return controlResponsePoller_->errorMessage();
        }
    }

    return {};
}